

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O2

void __thiscall SQClosure::Finalize(SQClosure *this)

{
  SQFunctionProto *pSVar1;
  SQInteger _n_;
  long lVar2;
  long lVar3;
  
  pSVar1 = this->_function;
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < pSVar1->_noutervalues; lVar2 = lVar2 + 1) {
    SQObjectPtr::Null((SQObjectPtr *)((long)&(this->_outervalues->super_SQObject)._type + lVar3));
    lVar3 = lVar3 + 0x10;
  }
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < pSVar1->_ndefaultparams; lVar2 = lVar2 + 1) {
    SQObjectPtr::Null((SQObjectPtr *)((long)&(this->_defaultparams->super_SQObject)._type + lVar3));
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

void Finalize(){
        SQFunctionProto *f = _function;
        _NULL_SQOBJECT_VECTOR(_outervalues,f->_noutervalues);
        _NULL_SQOBJECT_VECTOR(_defaultparams,f->_ndefaultparams);
    }